

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O2

REF_STATUS
ref_split_edge_tri_quality
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,REF_BOOL *allowed)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  undefined8 uVar5;
  ulong uVar6;
  REF_INT RVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  double local_f8;
  REF_DBL area1;
  REF_DBL area0;
  REF_DBL quality1;
  REF_DBL quality0;
  REF_DBL quality;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  *allowed = 0;
  ref_cell = ref_grid->cell[3];
  uVar6 = 0xffffffff;
  RVar7 = -1;
  if (-1 < node0) {
    pRVar2 = ref_cell->ref_adj;
    uVar6 = 0xffffffff;
    RVar7 = -1;
    if (node0 < pRVar2->nnode) {
      uVar4 = pRVar2->first[(uint)node0];
      uVar6 = 0xffffffff;
      RVar7 = -1;
      if ((long)(int)uVar4 != -1) {
        RVar7 = pRVar2->item[(int)uVar4].ref;
        uVar6 = (ulong)uVar4;
      }
    }
  }
  local_f8 = 1.0;
LAB_001df5b5:
  if ((int)uVar6 == -1) {
    uVar6 = 0xffffffff;
    RVar7 = -1;
    if (-1 < node0) {
      pRVar2 = ref_cell->ref_adj;
      uVar6 = 0xffffffff;
      RVar7 = -1;
      if (node0 < pRVar2->nnode) {
        uVar4 = pRVar2->first[(uint)node0];
        uVar6 = 0xffffffff;
        RVar7 = -1;
        if ((long)(int)uVar4 != -1) {
          RVar7 = pRVar2->item[(int)uVar4].ref;
          uVar6 = (ulong)uVar4;
        }
      }
    }
    while ((int)uVar6 != -1) {
      for (iVar10 = 0; iVar10 < ref_cell->node_per; iVar10 = iVar10 + 1) {
        if (ref_cell->c2n[ref_cell->size_per * RVar7 + iVar10] == node1) {
          uVar4 = ref_cell_nodes(ref_cell,RVar7,nodes);
          if (uVar4 != 0) {
            pcVar8 = "cell nodes";
            uVar5 = 0x35b;
            goto LAB_001df6af;
          }
          iVar1 = ref_cell->node_per;
          for (lVar9 = 0; lVar9 < iVar1; lVar9 = lVar9 + 1) {
            if (nodes[lVar9] == node0) {
              nodes[lVar9] = new_node;
            }
          }
          uVar4 = ref_node_tri_quality(ref_node,nodes,&quality0);
          if (uVar4 != 0) {
            pcVar8 = "q0";
            uVar5 = 0x35f;
            goto LAB_001df6af;
          }
          uVar4 = ref_node_tri_area(ref_node,nodes,&area0);
          if (uVar4 != 0) {
            pcVar8 = "area0";
            uVar5 = 0x360;
            goto LAB_001df6af;
          }
          iVar1 = ref_cell->node_per;
          for (lVar9 = 0; lVar9 < iVar1; lVar9 = lVar9 + 1) {
            if (nodes[lVar9] == new_node) {
              nodes[lVar9] = node0;
            }
          }
          for (lVar9 = 0; lVar9 < iVar1; lVar9 = lVar9 + 1) {
            if (nodes[lVar9] == node1) {
              nodes[lVar9] = new_node;
            }
          }
          uVar4 = ref_node_tri_quality(ref_node,nodes,&quality1);
          if (uVar4 != 0) {
            pcVar8 = "q1";
            uVar5 = 0x366;
            goto LAB_001df6af;
          }
          uVar4 = ref_node_tri_area(ref_node,nodes,&area1);
          if (uVar4 != 0) {
            pcVar8 = "area1";
            uVar5 = 0x367;
            goto LAB_001df6af;
          }
          dVar11 = ref_grid->adapt->split_quality_absolute;
          if (quality0 < dVar11) {
            return 0;
          }
          if (quality1 < dVar11) {
            return 0;
          }
          dVar11 = ref_grid->adapt->split_quality_relative * local_f8;
          if (quality0 < dVar11) {
            return 0;
          }
          if (quality1 < dVar11) {
            return 0;
          }
          if (area0 < ref_node->min_volume) {
            return 0;
          }
          if (area1 < ref_node->min_volume) {
            return 0;
          }
        }
      }
      pRVar3 = ref_cell->ref_adj->item;
      uVar6 = (ulong)pRVar3[(int)uVar6].next;
      RVar7 = -1;
      if (uVar6 != 0xffffffffffffffff) {
        RVar7 = pRVar3[uVar6].ref;
      }
    }
    *allowed = 1;
    uVar4 = 0;
  }
  else {
    lVar9 = 0;
LAB_001df5ca:
    if (ref_cell->node_per <= (int)lVar9) goto LAB_001df63d;
    if (ref_cell->c2n[(long)ref_cell->size_per * (long)RVar7 + lVar9] != node1) {
LAB_001df638:
      lVar9 = lVar9 + 1;
      goto LAB_001df5ca;
    }
    uVar4 = ref_cell_nodes(ref_cell,RVar7,nodes);
    if (uVar4 == 0) {
      uVar4 = ref_node_tri_quality(ref_node,nodes,&quality);
      if (uVar4 != 0) {
        pcVar8 = "q";
        uVar5 = 0x356;
        goto LAB_001df6af;
      }
      if (quality <= local_f8) {
        local_f8 = quality;
      }
      goto LAB_001df638;
    }
    pcVar8 = "cell nodes";
    uVar5 = 0x354;
LAB_001df6af:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",uVar5,
           "ref_split_edge_tri_quality",(ulong)uVar4,pcVar8);
  }
  return uVar4;
LAB_001df63d:
  pRVar3 = ref_cell->ref_adj->item;
  uVar6 = (ulong)pRVar3[(int)uVar6].next;
  RVar7 = -1;
  if (uVar6 != 0xffffffffffffffff) {
    RVar7 = pRVar3[uVar6].ref;
  }
  goto LAB_001df5b5;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_tri_quality(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1, REF_INT new_node,
                                              REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_DBL quality, quality0, quality1;
  REF_DBL min_existing_quality;
  REF_DBL area0, area1;

  *allowed = REF_FALSE;

  min_existing_quality = 1.0;
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");

    RSS(ref_node_tri_quality(ref_node, nodes, &quality), "q");
    min_existing_quality = MIN(min_existing_quality, quality);
  }

  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_node_tri_quality(ref_node, nodes, &quality0), "q0");
    RSS(ref_node_tri_area(ref_node, nodes, &area0), "area0");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_node_tri_quality(ref_node, nodes, &quality1), "q1");
    RSS(ref_node_tri_area(ref_node, nodes, &area1), "area1");

    if (quality0 < ref_grid_adapt(ref_grid, split_quality_absolute) ||
        quality1 < ref_grid_adapt(ref_grid, split_quality_absolute) ||
        quality0 < ref_grid_adapt(ref_grid, split_quality_relative) *
                       min_existing_quality ||
        quality1 < ref_grid_adapt(ref_grid, split_quality_relative) *
                       min_existing_quality ||
        area0 < ref_node_min_volume(ref_node) ||
        area1 < ref_node_min_volume(ref_node))
      return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}